

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_open_address_hash.c
# Opt level: O3

void test_open_address_hashmap_delete_1(planck_unit_test_t *tc)

{
  planck_unit_result_t pVar1;
  ion_err_t iVar2;
  ion_status_t iVar3;
  void *value;
  int i;
  char str [10];
  ion_hashmap_t map;
  undefined4 local_68;
  char local_62 [10];
  ion_hashmap_t local_58;
  
  local_68 = 2;
  local_58.super.key_type = key_type_numeric_signed;
  local_58.super.compare = dictionary_compare_signed_value;
  oah_initialize(&local_58,oah_compute_simple_hash,key_type_numeric_signed,4,10,10);
  sprintf(local_62,"%02i is key",2);
  iVar3 = oah_insert(&local_58,&local_68,local_62);
  pVar1 = planck_unit_assert_true
                    (tc,(uint)(iVar3.error == '\0'),0x315,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash.c"
                     ,"condition was false, expected true");
  if (pVar1 != '\0') {
    pVar1 = planck_unit_assert_true
                      (tc,(uint)(iVar3.count == 1),0x316,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash.c"
                       ,"condition was false, expected true");
    if (pVar1 != '\0') {
      iVar3 = oah_delete(&local_58,&local_68);
      pVar1 = planck_unit_assert_true
                        (tc,(uint)(iVar3.error == '\0'),0x319,
                         "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash.c"
                         ,"condition was false, expected true");
      if (pVar1 != '\0') {
        pVar1 = planck_unit_assert_true
                          (tc,(uint)(((ulong)iVar3 & 0xffffffff00000000) == 0x100000000),0x31a,
                           "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash.c"
                           ,"condition was false, expected true");
        if (pVar1 != '\0') {
          value = malloc(10);
          iVar3 = oah_get(&local_58,&local_68,value);
          pVar1 = planck_unit_assert_true
                            (tc,(uint)(iVar3.error == '\x01'),0x321,
                             "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash.c"
                             ,"condition was false, expected true");
          if (pVar1 != '\0') {
            pVar1 = planck_unit_assert_true
                              (tc,(uint)((ulong)iVar3 >> 0x20 == 0),0x322,
                               "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash.c"
                               ,"condition was false, expected true");
            if (pVar1 != '\0') {
              if (value != (void *)0x0) {
                free(value);
              }
              iVar3 = oah_delete(&local_58,&local_68);
              pVar1 = planck_unit_assert_true
                                (tc,(uint)(iVar3.error == '\x01'),0x32a,
                                 "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash.c"
                                 ,"condition was false, expected true");
              if (pVar1 != '\0') {
                pVar1 = planck_unit_assert_true
                                  (tc,(uint)((ulong)iVar3 >> 0x20 == 0),0x32b,
                                   "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash.c"
                                   ,"condition was false, expected true");
                if (pVar1 != '\0') {
                  iVar2 = oah_destroy(&local_58);
                  pVar1 = planck_unit_assert_true
                                    (tc,(uint)(iVar2 == '\0'),0x32d,
                                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash.c"
                                     ,"condition was false, expected true");
                  if (pVar1 != '\0') {
                    return;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
}

Assistant:

void
test_open_address_hashmap_delete_1(
	planck_unit_test_t *tc
) {
	ion_hashmap_t	map;							/* create handler for hashmap */
	int				i = 2;
	ion_status_t	status;

	initialize_hash_map_std_conditions(&map);

	char str[10];

	sprintf(str, "%02i is key", i);
	status = oah_insert(&map, (&i), str);
	PLANCK_UNIT_ASSERT_TRUE(tc, err_ok == status.error);
	PLANCK_UNIT_ASSERT_TRUE(tc, 1 == status.count);

	status = oah_delete(&map, (&i));
	PLANCK_UNIT_ASSERT_TRUE(tc, err_ok == status.error);
	PLANCK_UNIT_ASSERT_TRUE(tc, 1 == status.count);

	/* Check that value is not there */
	ion_value_t value;

	value	= malloc(10);
	status	= oah_get(&map, (&i), value);
	PLANCK_UNIT_ASSERT_TRUE(tc, err_item_not_found == status.error);
	PLANCK_UNIT_ASSERT_TRUE(tc, 0 == status.count);

	if (value != NULL) {
		free(value);
	}

	/* Check that value can not be deleted if it is not there already */
	status = oah_delete(&map, (&i));
	PLANCK_UNIT_ASSERT_TRUE(tc, err_item_not_found == status.error);
	PLANCK_UNIT_ASSERT_TRUE(tc, 0 == status.count);

	PLANCK_UNIT_ASSERT_TRUE(tc, err_ok == oah_destroy(&map));
}